

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# choices.hpp
# Opt level: O2

int Random::WeightedChoiceIndex<std::shared_ptr<Reaction>>
              (vector<std::shared_ptr<Reaction>,_std::allocator<std::shared_ptr<Reaction>_>_>
               *population,vector<double,_std::allocator<double>_> *weights)

{
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> _Var1;
  double extraout_XMM0_Qa;
  vector<double,_std::allocator<double>_> cum_weights;
  double local_38;
  _Vector_base<double,_std::allocator<double>_> local_30;
  
  random();
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&local_30,
             (long)(weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3,(allocator_type *)&local_38);
  std::
  partial_sum<__gnu_cxx::__normal_iterator<double_const*,std::vector<double,std::allocator<double>>>,__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>
            ((__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
             (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start,
             (__normal_iterator<const_double_*,_std::vector<double,_std::allocator<double>_>_>)
             (weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_finish,
             (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>)
             local_30._M_impl.super__Vector_impl_data._M_start);
  local_38 = extraout_XMM0_Qa * local_30._M_impl.super__Vector_impl_data._M_finish[-1];
  _Var1 = std::
          __upper_bound<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,double,__gnu_cxx::__ops::_Val_less_iter>
                    (local_30._M_impl.super__Vector_impl_data._M_start,
                     local_30._M_impl.super__Vector_impl_data._M_finish,&local_38);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_30);
  return (int)((ulong)((long)_Var1._M_current -
                      (long)local_30._M_impl.super__Vector_impl_data._M_start) >> 3);
}

Assistant:

int WeightedChoiceIndex(const std::vector<T> &population,
                        const std::vector<double> &weights) {
  double random_num = random();
  // Calculate cumulative sums for weights
  std::vector<double> cum_weights(weights.size());
  std::partial_sum(weights.begin(), weights.end(), cum_weights.begin());
  // Bisect cumulative weights vector
  std::vector<double>::iterator upper;
  upper = std::upper_bound(cum_weights.begin(), cum_weights.end(),
                           random_num * cum_weights.back());
  // Calculate index and return list item at index
  int index = (upper - cum_weights.begin());
  return index;
}